

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<double,_3,_4> * __thiscall
math::Matrix<double,_3,_3>::mult<4>
          (Matrix<double,_3,_4> *__return_storage_ptr__,Matrix<double,_3,_3> *this,
          Matrix<double,_3,_4> *rhs)

{
  int i;
  long lVar1;
  double *pdVar2;
  int j;
  ulong uVar3;
  long lVar4;
  double dVar5;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    uVar3 = 0;
    pdVar2 = rhs->m;
    for (; uVar3 != 4; uVar3 = uVar3 + 1) {
      dVar5 = 0.0;
      for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 8) {
        dVar5 = dVar5 + *(double *)((long)this + lVar4) * *(double *)((long)pdVar2 + lVar4 * 4);
      }
      __return_storage_ptr__->m[uVar3 | lVar1 * 4] = dVar5;
      pdVar2 = pdVar2 + 1;
    }
    this = (Matrix<double,_3,_3> *)((long)this + 0x18);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<T,N,U>
Matrix<T,N,M>::mult (Matrix<T,M,U> const& rhs) const
{
    typedef algo::InterleavedIter<T,U> RowIter;
    Matrix<T,N,U> ret;
    for (int i = 0; i < ret.rows; ++i)
        for (int j = 0; j < ret.cols; ++j)
            ret(i,j) = std::inner_product(m + M * i,
                m + M * i + M, RowIter(*rhs + j), T(0));
    return ret;
}